

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::MergeFrom
          (GeneratedCodeInfo_Annotation *this,GeneratedCodeInfo_Annotation *from)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  string *initial_value;
  string *psVar5;
  Arena *arena;
  
  pvVar4 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe));
  }
  iVar1 = (from->path_).current_size_;
  if (iVar1 != 0) {
    iVar2 = (this->path_).current_size_;
    RepeatedField<int>::Reserve(&this->path_,iVar1 + iVar2);
    (this->path_).current_size_ = (this->path_).current_size_ + (from->path_).current_size_;
    memcpy((void *)((long)iVar2 * 4 + (long)(this->path_).arena_or_elements_),
           (from->path_).arena_or_elements_,(long)(from->path_).current_size_ << 2);
  }
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 7) != 0) {
    if ((uVar3 & 1) != 0) {
      initial_value = (from->source_file_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      arena = (Arena *)(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (this->source_file_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->source_file_,arena,initial_value);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
    }
    if ((uVar3 & 2) != 0) {
      this->begin_ = from->begin_;
    }
    if ((uVar3 & 4) != 0) {
      this->end_ = from->end_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar3;
  }
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::MergeFrom(const GeneratedCodeInfo_Annotation& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.GeneratedCodeInfo.Annotation)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  path_.MergeFrom(from.path_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_source_file(from._internal_source_file());
    }
    if (cached_has_bits & 0x00000002u) {
      begin_ = from.begin_;
    }
    if (cached_has_bits & 0x00000004u) {
      end_ = from.end_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}